

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int P_StartScript(AActor *who,line_t *where,int script,char *map,int *args,int argcount,int flags)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  level_info_t *i_00;
  FString local_78;
  DLevelScript *local_70;
  DLevelScript *runningScript;
  int i;
  FString local_58;
  ScriptPtr *local_50;
  ScriptPtr *scriptdata;
  FBehavior *module;
  int *piStack_38;
  int argcount_local;
  int *args_local;
  char *map_local;
  line_t *plStack_20;
  int script_local;
  line_t *where_local;
  AActor *who_local;
  
  module._4_4_ = argcount;
  piStack_38 = args;
  args_local = (int *)map;
  map_local._4_4_ = script;
  plStack_20 = where;
  where_local = (line_t *)who;
  if (map != (char *)0x0) {
    pcVar3 = FString::operator_cast_to_char_(&level.MapName);
    iVar2 = strncasecmp(pcVar3,(char *)args_local,8);
    if (iVar2 != 0) {
      i_00 = FindLevelInfo((char *)args_local,true);
      addDefered(i_00,(uint)((flags & 2U) != 0),map_local._4_4_,piStack_38,module._4_4_,
                 (AActor *)where_local);
      return 1;
    }
  }
  scriptdata = (ScriptPtr *)0x0;
  local_50 = FBehavior::StaticFindScript(map_local._4_4_,(FBehavior **)&scriptdata);
  if (local_50 == (ScriptPtr *)0x0) {
    if (((flags & 8U) == 0) ||
       ((where_local != (line_t *)0x0 &&
        (*(undefined8 **)(where_local[3].args + 3) == &players + (long)consoleplayer * 0x54)))) {
      ScriptPresentation((int)&local_78);
      pcVar3 = FString::GetChars(&local_78);
      Printf("P_StartScript: Unknown %s\n",pcVar3);
      FString::~FString(&local_78);
    }
    who_local._4_4_ = 0;
  }
  else if (((((flags & 8U) == 0) || ((netgame & 1U) == 0)) ||
           (bVar1 = FBoolCVar::operator_cast_to_bool(&sv_cheats), bVar1)) ||
          ((local_50->Flags & 1) != 0)) {
    local_70 = P_GetScriptGoing((AActor *)where_local,plStack_20,map_local._4_4_,local_50,
                                (FBehavior *)scriptdata,piStack_38,module._4_4_,flags);
    if (local_70 == (DLevelScript *)0x0) {
      who_local._4_4_ = 0;
    }
    else if ((flags & 4U) == 0) {
      who_local._4_4_ = 1;
    }
    else {
      who_local._4_4_ = DLevelScript::RunScript(local_70);
    }
  }
  else {
    pcVar3 = userinfo_t::GetName((userinfo_t *)(*(long *)(where_local[3].args + 3) + 0x38));
    ScriptPresentation((int)&local_58);
    pcVar4 = FString::GetChars(&local_58);
    Printf(200,"%s tried to puke %s (\n",pcVar3,pcVar4);
    FString::~FString(&local_58);
    for (runningScript._0_4_ = 0; (int)runningScript < module._4_4_;
        runningScript._0_4_ = (int)runningScript + 1) {
      pcVar3 = ", ";
      if ((int)runningScript == module._4_4_ + -1) {
        pcVar3 = "";
      }
      Printf(200,"%d%s",(ulong)(uint)piStack_38[(int)runningScript],pcVar3);
    }
    Printf(200,")\n");
    who_local._4_4_ = 0;
  }
  return who_local._4_4_;
}

Assistant:

int P_StartScript (AActor *who, line_t *where, int script, const char *map, const int *args, int argcount, int flags)
{
	if (map == NULL || 0 == strnicmp (level.MapName, map, 8))
	{
		FBehavior *module = NULL;
		const ScriptPtr *scriptdata;

		if ((scriptdata = FBehavior::StaticFindScript (script, module)) != NULL)
		{
			if ((flags & ACS_NET) && netgame && !sv_cheats)
			{
				// If playing multiplayer and cheats are disallowed, check to
				// make sure only net scripts are run.
				if (!(scriptdata->Flags & SCRIPTF_Net))
				{
					Printf(PRINT_BOLD, "%s tried to puke %s (\n",
						who->player->userinfo.GetName(), ScriptPresentation(script).GetChars());
					for (int i = 0; i < argcount; ++i)
					{
						Printf(PRINT_BOLD, "%d%s", args[i], i == argcount-1 ? "" : ", ");
					}
					Printf(PRINT_BOLD, ")\n");
					return false;
				}
			}
			DLevelScript *runningScript = P_GetScriptGoing (who, where, script,
				scriptdata, module, args, argcount, flags);
			if (runningScript != NULL)
			{
				if (flags & ACS_WANTRESULT)
				{
					return runningScript->RunScript();
				}
				return true;
			}
			return false;
		}
		else
		{
			if (!(flags & ACS_NET) || (who && who->player == &players[consoleplayer]))
			{
				Printf("P_StartScript: Unknown %s\n", ScriptPresentation(script).GetChars());
			}
		}
	}
	else
	{
		addDefered (FindLevelInfo (map),
					(flags & ACS_ALWAYS) ? acsdefered_t::defexealways : acsdefered_t::defexecute,
					script, args, argcount, who);
		return true;
	}
	return false;
}